

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identityref.c
# Opt level: O1

void * lyplg_type_print_identityref
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,void *prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  lysc_ident *plVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *ret;
  char *local_20;
  
  if (format == LY_VALUE_CANON) {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar4 = strlen(value->_canonical);
      *value_len = sVar4;
    }
    local_20 = value->_canonical;
  }
  else {
    plVar1 = (value->field_2).ident;
    pcVar3 = lyplg_type_get_prefix(plVar1->module,format,prefix_data);
    if (pcVar3 == (char *)0x0) {
      iVar2 = asprintf(&local_20,"%s",plVar1->name);
    }
    else {
      iVar2 = asprintf(&local_20,"%s:%s",pcVar3);
    }
    if ((value_len != (size_t *)0x0) && (iVar2 != -1)) {
      *value_len = (long)iVar2;
    }
    if (iVar2 == -1) {
      local_20 = (char *)0x0;
    }
    else {
      *dynamic = '\x01';
    }
  }
  return local_20;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_identityref(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *prefix_data, ly_bool *dynamic, size_t *value_len)
{
    char *ret;

    if (format == LY_VALUE_CANON) {
        if (dynamic) {
            *dynamic = 0;
        }
        if (value_len) {
            *value_len = strlen(value->_canonical);
        }
        return value->_canonical;
    }

    /* print the value in the specific format */
    if (identityref_ident2str(value->ident, format, prefix_data, &ret, value_len)) {
        return NULL;
    }
    *dynamic = 1;
    return ret;
}